

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::~bufferCollection(bufferCollection *this)

{
  Buffer *this_00;
  bool bVar1;
  pointer ppVar2;
  __normal_iterator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair_*,_std::vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>_>
  local_20;
  iterator end;
  iterator it;
  bufferCollection *this_local;
  
  end = std::
        vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
        ::begin(&this->m_vector);
  local_20._M_current =
       (pair *)std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
               ::end(&this->m_vector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&end);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair_*,_std::vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>_>
             ::operator->(&end);
    if (ppVar2->m_buffer != (Buffer *)0x0) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair_*,_std::vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>_>
               ::operator->(&end);
      this_00 = ppVar2->m_buffer;
      if (this_00 != (Buffer *)0x0) {
        Utils::Buffer::~Buffer(this_00);
        operator_delete(this_00,0x10);
      }
      ppVar2 = __gnu_cxx::
               __normal_iterator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair_*,_std::vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>_>
               ::operator->(&end);
      ppVar2->m_buffer = (Buffer *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair_*,_std::vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>_>
    ::operator++(&end);
  }
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ::~vector(&this->m_vector);
  return;
}

Assistant:

BufferTestBase::bufferCollection::~bufferCollection()
{
	for (Vector::iterator it = m_vector.begin(), end = m_vector.end(); end != it; ++it)
	{
		if (0 != it->m_buffer)
		{
			delete it->m_buffer;
			it->m_buffer = 0;
		}
	}
}